

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O3

Pubkey * __thiscall cfd::core::Pubkey::Uncompress(Pubkey *__return_storage_ptr__,Pubkey *this)

{
  bool bVar1;
  uchar *bytes_out;
  CfdException *this_00;
  value_type_conflict *__val;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int local_8c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  ByteData local_58;
  string local_40;
  
  bVar1 = IsCompress(this);
  if (bVar1) {
    bytes_out = (uchar *)operator_new(0x41);
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = bytes_out + 0x41;
    bytes_out[0] = '\0';
    bytes_out[1] = '\0';
    bytes_out[2] = '\0';
    bytes_out[3] = '\0';
    bytes_out[4] = '\0';
    bytes_out[5] = '\0';
    bytes_out[6] = '\0';
    bytes_out[7] = '\0';
    bytes_out[8] = '\0';
    bytes_out[9] = '\0';
    bytes_out[10] = '\0';
    bytes_out[0xb] = '\0';
    bytes_out[0xc] = '\0';
    bytes_out[0xd] = '\0';
    bytes_out[0xe] = '\0';
    bytes_out[0xf] = '\0';
    bytes_out[0x10] = '\0';
    bytes_out[0x11] = '\0';
    bytes_out[0x12] = '\0';
    bytes_out[0x13] = '\0';
    bytes_out[0x14] = '\0';
    bytes_out[0x15] = '\0';
    bytes_out[0x16] = '\0';
    bytes_out[0x17] = '\0';
    bytes_out[0x18] = '\0';
    bytes_out[0x19] = '\0';
    bytes_out[0x1a] = '\0';
    bytes_out[0x1b] = '\0';
    bytes_out[0x1c] = '\0';
    bytes_out[0x1d] = '\0';
    bytes_out[0x1e] = '\0';
    bytes_out[0x1f] = '\0';
    bytes_out[0x20] = '\0';
    bytes_out[0x21] = '\0';
    bytes_out[0x22] = '\0';
    bytes_out[0x23] = '\0';
    bytes_out[0x24] = '\0';
    bytes_out[0x25] = '\0';
    bytes_out[0x26] = '\0';
    bytes_out[0x27] = '\0';
    bytes_out[0x28] = '\0';
    bytes_out[0x29] = '\0';
    bytes_out[0x2a] = '\0';
    bytes_out[0x2b] = '\0';
    bytes_out[0x2c] = '\0';
    bytes_out[0x2d] = '\0';
    bytes_out[0x2e] = '\0';
    bytes_out[0x2f] = '\0';
    bytes_out[0x30] = '\0';
    bytes_out[0x31] = '\0';
    bytes_out[0x32] = '\0';
    bytes_out[0x33] = '\0';
    bytes_out[0x34] = '\0';
    bytes_out[0x35] = '\0';
    bytes_out[0x36] = '\0';
    bytes_out[0x37] = '\0';
    bytes_out[0x38] = '\0';
    bytes_out[0x39] = '\0';
    bytes_out[0x3a] = '\0';
    bytes_out[0x3b] = '\0';
    bytes_out[0x3c] = '\0';
    bytes_out[0x3d] = '\0';
    bytes_out[0x3e] = '\0';
    bytes_out[0x3f] = '\0';
    bytes_out[0x40] = '\0';
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = bytes_out;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ByteData::GetBytes(&local_70,&this->data_);
    local_8c = wally_ec_public_key_decompress
                         (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_70.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_70.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,bytes_out,0x41);
    if (local_8c != 0) {
      local_40._M_dataplus._M_p = "cfdcore_key.cpp";
      local_40._M_string_length._0_4_ = 0x96;
      local_40.field_2._M_allocated_capacity = (long)"Parse_Privkey_Mainnet_Uncompress" + 0x16;
      logger::log<int&>((CfdSourceLocation *)&local_40,kCfdLogLevelWarning,
                        "wally_ec_public_key_decompress error. ret={}",&local_8c);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Failed to uncompress pubkey.","");
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_40);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::ByteData(&local_58,&local_88);
    Pubkey(__return_storage_ptr__,&local_58);
    if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::Uncompress() const {
  if (!IsCompress()) {
    return *this;
  }

  // The conversion from uncompress to compress is irreversible.
  // (if convert compress to uncompress, prefix is '04'. Not '06' or '07'.)
  std::vector<uint8_t> decompress_data(EC_PUBLIC_KEY_UNCOMPRESSED_LEN);
  std::vector<uint8_t> data = data_.GetBytes();
  int ret = wally_ec_public_key_decompress(
      data.data(), data.size(), decompress_data.data(),
      decompress_data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_ec_public_key_decompress error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Failed to uncompress pubkey.");
  }
  return Pubkey(decompress_data);
}